

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_bit.c
# Opt level: O1

int lj_ffh_bit_lshift(lua_State *L)

{
  undefined2 uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  void *pvVar4;
  int iVar5;
  CTypeID id2;
  CTypeID id;
  CTypeID local_38;
  CTypeID local_34;
  
  _local_38 = 0;
  uVar2 = lj_carith_check64(L,1,&local_34);
  iVar5 = 2;
  uVar3 = lj_carith_check64(L,2,&local_38);
  if (local_34 == 0) {
    if (local_38 != 0) {
      L->base[1].n = (double)(int)uVar3;
    }
    iVar5 = 0;
  }
  else {
    uVar2 = lj_carith_shift64(uVar2,(int)uVar3,
                              *(byte *)((L->base[-2].u64 & 0x7fffffffffff) + 10) - 0x45);
    uVar1 = (undefined2)local_34;
    pvVar4 = lj_mem_newgco(L,0x18);
    *(undefined1 *)((long)pvVar4 + 9) = 10;
    *(undefined2 *)((long)pvVar4 + 10) = uVar1;
    *(uint64_t *)((long)pvVar4 + 0x10) = uVar2;
    L->base[-2].u64 = (ulong)pvVar4 | 0xfffa800000000000;
  }
  return iVar5;
}

Assistant:

LJLIB_ASM(bit_lshift)		LJLIB_REC(bit_shift IR_BSHL)
{
#if LJ_HASFFI
  CTypeID id = 0, id2 = 0;
  uint64_t x = lj_carith_check64(L, 1, &id);
  int32_t sh = (int32_t)lj_carith_check64(L, 2, &id2);
  if (id) {
    x = lj_carith_shift64(x, sh, curr_func(L)->c.ffid - (int)FF_bit_lshift);
    return bit_result64(L, id, x);
  }
  if (id2) setintV(L->base+1, sh);
  return FFH_RETRY;
#else
  lj_lib_checknumber(L, 1);
  bit_checkbit(L, 2);
  return FFH_RETRY;
#endif
}